

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::TruncCase::compare(TruncCase *this,void **inputs,void **outputs)

{
  float fVar1;
  Precision PVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  ostringstream *poVar6;
  int iVar7;
  uint uVar8;
  deUint32 aBits;
  bool bVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  ulong uVar13;
  int iVar14;
  deUint32 u32;
  deUint32 bBits;
  float fVar15;
  float fVar16;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar2 - PRECISION_MEDIUMP < 2) {
    if (0 < (int)uVar4) {
      uVar13 = 0;
      do {
        fVar11 = *(float *)((long)*inputs + uVar13 * 4);
        if ((int)fVar11 < 0) {
          fVar15 = -(float)(int)-fVar11;
        }
        else {
          fVar15 = (float)(int)fVar11;
        }
        fVar1 = *(float *)((long)*outputs + uVar13 * 4);
        if (((fVar1 == 0.0) && (fVar11 = fVar15, !NAN(fVar1))) ||
           ((fVar15 == 0.0 && (fVar11 = fVar1, !NAN(fVar15))))) {
          fVar11 = ABS(fVar11);
        }
        else {
          fVar11 = (float)((int)fVar15 - (int)fVar1);
          if ((uint)fVar15 < (uint)fVar1) {
            fVar11 = (float)-((int)fVar15 - (int)fVar1);
          }
        }
        if (fVar11 != 0.0) {
          poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar6->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
          local_34.value = fVar15;
          poVar5 = Functional::operator<<(poVar5,&local_34);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got ULP diff ",0xf);
LAB_014d068e:
          local_40.value = (deUint64)(uint)fVar11;
          tcu::Format::Hex<8UL>::toStream(&local_40,poVar5);
          return false;
        }
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
    }
  }
  else {
    uVar8 = -1 << (0x17 - (&DAT_01c9ed3c)[(ulong)PVar2 * 4] & 0x1f);
    if (0 < (int)uVar4) {
      fVar11 = (float)~uVar8;
      fVar15 = (float)(uVar8 & 0x7fffff ^ 0x3fffffff) + -1.0;
      uVar13 = 0;
      do {
        fVar1 = *(float *)((long)*inputs + uVar13 * 4);
        iVar14 = (int)(fVar1 - fVar15);
        iVar7 = (int)(fVar1 + fVar15);
        if (iVar7 < iVar14) {
LAB_014d0592:
          poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar6->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = [",5);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] with ULP threshold ",0x15);
          goto LAB_014d068e;
        }
        fVar1 = *(float *)((long)*outputs + uVar13 * 4);
        iVar10 = iVar14;
        do {
          fVar16 = (float)iVar10;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            fVar12 = ABS(fVar1);
            if (iVar10 != 0) {
              fVar12 = (float)((int)fVar16 - (int)fVar1);
              if ((uint)fVar16 < (uint)fVar1) {
                fVar12 = (float)-((int)fVar16 - (int)fVar1);
              }
            }
          }
          else {
            fVar12 = ABS(fVar16);
          }
          bVar9 = false;
          if ((uint)fVar12 <= (uint)fVar11) {
            bVar9 = true;
            break;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 <= iVar7);
        if (!bVar9) goto LAB_014d0592;
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar4);
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const bool		isNeg		= tcu::Float32(in0).sign() < 0;
				const float		ref			= isNeg ? (-float(int(-in0))) : float(int(in0));

				// \note: trunc() function definition is a bit broad on negative zeros. Ignore result sign if zero.
				const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(in0-eps);
				const int		maxRes		= int(in0+eps);
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}